

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::DescriptorPool::Tables::AddFile(Tables *this,FileDescriptor *file)

{
  bool bVar1;
  second_type *value;
  unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
  *collection;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  FileDescriptor *in_RSI;
  long in_RDI;
  value_type *in_stack_ffffffffffffffb8;
  first_type *in_stack_ffffffffffffffd8;
  
  value = (second_type *)(in_RDI + 0x170);
  FileDescriptor::name_abi_cxx11_(in_RSI);
  collection = (unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
                *)std::__cxx11::string::c_str();
  bVar1 = InsertIfNotPresent<std::unordered_map<char_const*,google::protobuf::FileDescriptor_const*,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::FileDescriptor_const*>>>>
                    (collection,in_stack_ffffffffffffffd8,value);
  if (bVar1) {
    this_00 = (vector<const_char_*,_std::allocator<const_char_*>_> *)(in_RDI + 0x208);
    FileDescriptor::name_abi_cxx11_(in_RSI);
    std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (this_00,in_stack_ffffffffffffffb8);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddFile(const FileDescriptor* file) {
  if (InsertIfNotPresent(&files_by_name_, file->name().c_str(), file)) {
    files_after_checkpoint_.push_back(file->name().c_str());
    return true;
  } else {
    return false;
  }
}